

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cursor.c
# Opt level: O0

void key_callback(GLFWwindow *window,int key,int scancode,int action,int mods)

{
  int iVar1;
  GLFWmonitor *pGVar2;
  GLFWvidmode *pGVar3;
  char *pcVar4;
  GLFWvidmode *mode;
  GLFWmonitor *monitor;
  int height_1;
  int width_1;
  double y_1;
  double x_1;
  int mods_local;
  int action_local;
  int scancode_local;
  int key_local;
  GLFWwindow *window_local;
  
  if (action == 1) {
    x_1._0_4_ = mods;
    x_1._4_4_ = action;
    mods_local = scancode;
    action_local = key;
    _scancode_local = window;
    if (key == 0x20) {
      swap_interval = 1 - swap_interval;
      printf("(( swap interval: %i ))\n",(ulong)(uint)swap_interval);
      glfwSwapInterval(swap_interval);
    }
    else if (key == 0x30) {
      glfwSetCursor(window,(GLFWcursor *)0x0);
    }
    else if (key == 0x31) {
      glfwSetCursor(window,standard_cursors[0]);
    }
    else if (key == 0x32) {
      glfwSetCursor(window,standard_cursors[1]);
    }
    else if (key == 0x33) {
      glfwSetCursor(window,standard_cursors[2]);
    }
    else if (key == 0x34) {
      glfwSetCursor(window,standard_cursors[3]);
    }
    else if (key == 0x35) {
      glfwSetCursor(window,standard_cursors[4]);
    }
    else if (key == 0x36) {
      glfwSetCursor(window,standard_cursors[5]);
    }
    else if (key == 0x41) {
      animate_cursor = (int)((animate_cursor != 0 ^ 0xffU) & 1);
      if (animate_cursor == 0) {
        glfwSetCursor(window,(GLFWcursor *)0x0);
      }
    }
    else if (key == 0x44) {
      glfwSetInputMode(window,0x33001,0x34003);
      printf("(( cursor is disabled ))\n");
    }
    else if (key == 0x48) {
      glfwSetInputMode(window,0x33001,0x34002);
      printf("(( cursor is hidden ))\n");
    }
    else {
      if (key != 0x4e) {
        if (key == 0x50) {
          glfwGetCursorPos(window,&y_1,(double *)&height_1);
          printf("Query before set: %f %f (%+f %+f)\n",y_1,_height_1,y_1 - cursor_x,
                 _height_1 - cursor_y);
          cursor_x = y_1;
          cursor_y = _height_1;
          glfwSetCursorPos(_scancode_local,y_1,_height_1);
          glfwGetCursorPos(_scancode_local,&y_1,(double *)&height_1);
          printf("Query after set: %f %f (%+f %+f)\n",y_1,_height_1,y_1 - cursor_x,
                 _height_1 - cursor_y);
          cursor_x = y_1;
          cursor_y = _height_1;
          return;
        }
        if (key == 0x52) {
          iVar1 = glfwRawMouseMotionSupported();
          if (iVar1 == 0) {
            return;
          }
          iVar1 = glfwGetInputMode(_scancode_local,0x33005);
          if (iVar1 != 0) {
            glfwSetInputMode(_scancode_local,0x33005,0);
            printf("(( raw input is disabled ))\n");
            return;
          }
          glfwSetInputMode(_scancode_local,0x33005,1);
          printf("(( raw input is enabled ))\n");
          return;
        }
        if (key == 0x54) {
          track_cursor = (int)((track_cursor != 0 ^ 0xffU) & 1);
          if (track_cursor != 0) {
            glfwSetCursor(window,tracking_cursor);
            return;
          }
          glfwSetCursor(window,(GLFWcursor *)0x0);
          return;
        }
        if (key == 0x57) {
          wait_events = (int)((wait_events != 0 ^ 0xffU) & 1);
          pcVar4 = "poll";
          if (wait_events != 0) {
            pcVar4 = "wait";
          }
          printf("(( %sing for events ))\n",pcVar4);
          return;
        }
        if (key != 0x100) {
          if (key != 0x101) {
            if (key == 0x108) {
              glfwGetWindowSize(window,(int *)((long)&monitor + 4),(int *)&monitor);
              glfwSetCursorPos(_scancode_local,(double)(monitor._4_4_ + -1),
                               (double)((int)monitor + -1));
              glfwGetCursorPos(_scancode_local,&cursor_x,&cursor_y);
              return;
            }
            if (key == 0x109) {
              glfwSetCursorPos(window,0.0,0.0);
              glfwGetCursorPos(_scancode_local,&cursor_x,&cursor_y);
              return;
            }
            if (key != 300) {
              return;
            }
          }
          if (mods != 4) {
            return;
          }
          pGVar2 = glfwGetWindowMonitor(window);
          if (pGVar2 == (GLFWmonitor *)0x0) {
            pGVar2 = glfwGetPrimaryMonitor();
            pGVar3 = glfwGetVideoMode(pGVar2);
            glfwGetWindowPos(_scancode_local,&key_callback::x,&key_callback::y);
            glfwGetWindowSize(_scancode_local,&key_callback::width,&key_callback::height);
            glfwSetWindowMonitor
                      (_scancode_local,pGVar2,0,0,pGVar3->width,pGVar3->height,pGVar3->refreshRate);
          }
          else {
            glfwSetWindowMonitor
                      (_scancode_local,(GLFWmonitor *)0x0,key_callback::x,key_callback::y,
                       key_callback::width,key_callback::height,0);
          }
          glfwGetCursorPos(_scancode_local,&cursor_x,&cursor_y);
          return;
        }
        iVar1 = glfwGetInputMode(window,0x33001);
        if (iVar1 != 0x34003) {
          glfwSetWindowShouldClose(_scancode_local,1);
          return;
        }
      }
      glfwSetInputMode(_scancode_local,0x33001,0x34001);
      glfwGetCursorPos(_scancode_local,&cursor_x,&cursor_y);
      printf("(( cursor is normal ))\n");
    }
  }
  return;
}

Assistant:

static void key_callback(GLFWwindow* window, int key, int scancode, int action, int mods)
{
    if (action != GLFW_PRESS)
        return;

    switch (key)
    {
        case GLFW_KEY_A:
        {
            animate_cursor = !animate_cursor;
            if (!animate_cursor)
                glfwSetCursor(window, NULL);

            break;
        }

        case GLFW_KEY_ESCAPE:
        {
            if (glfwGetInputMode(window, GLFW_CURSOR) != GLFW_CURSOR_DISABLED)
            {
                glfwSetWindowShouldClose(window, GLFW_TRUE);
                break;
            }

            /* FALLTHROUGH */
        }

        case GLFW_KEY_N:
            glfwSetInputMode(window, GLFW_CURSOR, GLFW_CURSOR_NORMAL);
            glfwGetCursorPos(window, &cursor_x, &cursor_y);
            printf("(( cursor is normal ))\n");
            break;

        case GLFW_KEY_D:
            glfwSetInputMode(window, GLFW_CURSOR, GLFW_CURSOR_DISABLED);
            printf("(( cursor is disabled ))\n");
            break;

        case GLFW_KEY_H:
            glfwSetInputMode(window, GLFW_CURSOR, GLFW_CURSOR_HIDDEN);
            printf("(( cursor is hidden ))\n");
            break;

        case GLFW_KEY_R:
            if (!glfwRawMouseMotionSupported())
                break;

            if (glfwGetInputMode(window, GLFW_RAW_MOUSE_MOTION))
            {
                glfwSetInputMode(window, GLFW_RAW_MOUSE_MOTION, GLFW_FALSE);
                printf("(( raw input is disabled ))\n");
            }
            else
            {
                glfwSetInputMode(window, GLFW_RAW_MOUSE_MOTION, GLFW_TRUE);
                printf("(( raw input is enabled ))\n");
            }
            break;

        case GLFW_KEY_SPACE:
            swap_interval = 1 - swap_interval;
            printf("(( swap interval: %i ))\n", swap_interval);
            glfwSwapInterval(swap_interval);
            break;

        case GLFW_KEY_W:
            wait_events = !wait_events;
            printf("(( %sing for events ))\n", wait_events ? "wait" : "poll");
            break;

        case GLFW_KEY_T:
            track_cursor = !track_cursor;
            if (track_cursor)
                glfwSetCursor(window, tracking_cursor);
            else
                glfwSetCursor(window, NULL);

            break;

        case GLFW_KEY_P:
        {
            double x, y;
            glfwGetCursorPos(window, &x, &y);

            printf("Query before set: %f %f (%+f %+f)\n",
                   x, y, x - cursor_x, y - cursor_y);
            cursor_x = x;
            cursor_y = y;

            glfwSetCursorPos(window, cursor_x, cursor_y);
            glfwGetCursorPos(window, &x, &y);

            printf("Query after set: %f %f (%+f %+f)\n",
                   x, y, x - cursor_x, y - cursor_y);
            cursor_x = x;
            cursor_y = y;
            break;
        }

        case GLFW_KEY_UP:
            glfwSetCursorPos(window, 0, 0);
            glfwGetCursorPos(window, &cursor_x, &cursor_y);
            break;

        case GLFW_KEY_DOWN:
        {
            int width, height;
            glfwGetWindowSize(window, &width, &height);
            glfwSetCursorPos(window, width - 1, height - 1);
            glfwGetCursorPos(window, &cursor_x, &cursor_y);
            break;
        }

        case GLFW_KEY_0:
            glfwSetCursor(window, NULL);
            break;

        case GLFW_KEY_1:
            glfwSetCursor(window, standard_cursors[0]);
            break;

        case GLFW_KEY_2:
            glfwSetCursor(window, standard_cursors[1]);
            break;

        case GLFW_KEY_3:
            glfwSetCursor(window, standard_cursors[2]);
            break;

        case GLFW_KEY_4:
            glfwSetCursor(window, standard_cursors[3]);
            break;

        case GLFW_KEY_5:
            glfwSetCursor(window, standard_cursors[4]);
            break;

        case GLFW_KEY_6:
            glfwSetCursor(window, standard_cursors[5]);
            break;

        case GLFW_KEY_F11:
        case GLFW_KEY_ENTER:
        {
            static int x, y, width, height;

            if (mods != GLFW_MOD_ALT)
                return;

            if (glfwGetWindowMonitor(window))
                glfwSetWindowMonitor(window, NULL, x, y, width, height, 0);
            else
            {
                GLFWmonitor* monitor = glfwGetPrimaryMonitor();
                const GLFWvidmode* mode = glfwGetVideoMode(monitor);
                glfwGetWindowPos(window, &x, &y);
                glfwGetWindowSize(window, &width, &height);
                glfwSetWindowMonitor(window, monitor,
                                     0, 0, mode->width, mode->height,
                                     mode->refreshRate);
            }

            glfwGetCursorPos(window, &cursor_x, &cursor_y);
            break;
        }
    }
}